

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O3

ScenarioLowerBound * __thiscall
despot::SimpleRockSample::CreateScenarioLowerBound
          (SimpleRockSample *this,string *name,string *particle_bound_name)

{
  pointer pcVar1;
  int iVar2;
  DefaultPolicy *this_00;
  ParticleLowerBound *pPVar3;
  TrivialParticleLowerBound *this_01;
  ostream *poVar4;
  long *local_40 [2];
  long local_30 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)name), iVar2 == 0)) {
    this_01 = (TrivialParticleLowerBound *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound(this_01,&this->super_DSPOMDP);
    return (ScenarioLowerBound *)this_01;
  }
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound algorithm: ");
    poVar4 = std::operator<<(poVar4,(string *)name);
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(0);
  }
  this_00 = (DefaultPolicy *)operator_new(0x20);
  pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
  pPVar3 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_40);
  despot::DefaultPolicy::DefaultPolicy(this_00,&this->super_DSPOMDP,pPVar3);
  *(undefined ***)this_00 = &PTR__DefaultPolicy_0010acb0;
  if (local_40[0] == local_30) {
    return (ScenarioLowerBound *)this_00;
  }
  operator_delete(local_40[0],local_30[0] + 1);
  return (ScenarioLowerBound *)this_00;
}

Assistant:

ScenarioLowerBound* SimpleRockSample::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	ScenarioLowerBound* bound = NULL;
	if (name == "TRIVIAL" || name == "DEFAULT") {
		bound = new TrivialParticleLowerBound(this);
	} else if (name == "EAST") {
		bound = new SimpleRockSampleEastPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		cerr << "Unsupported lower bound algorithm: " << name << endl;
		exit(0);
	}
	return bound;
}